

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::_q_handleFieldObjectDestroyed(QWizardPrivate *this,QObject *object)

{
  QList<QWizardField> *this_00;
  QMap<QString,_int> *pQVar1;
  int iVar2;
  QMapData<std::map<QString,_int,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>_>
  *pQVar3;
  iterator abegin;
  iterator iVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  _Base_ptr *pp_Var7;
  int iVar8;
  long in_FS_OFFSET;
  int local_5c;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->fields;
  abegin = QList<QWizardField>::begin(this_00);
  iVar4 = QList<QWizardField>::end(this_00);
  if (abegin.i == iVar4.i) {
    iVar8 = -1;
  }
  else {
    pQVar1 = &this->fieldIndexMap;
    iVar8 = -1;
    do {
      if ((abegin.i)->object == object) {
        local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,0xffffffff);
        pQVar3 = (pQVar1->d).d.ptr;
        pp_Var7 = (_Base_ptr *)&local_58;
        if (pQVar3 != (QMapData<std::map<QString,_int,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>_>
                       *)0x0) {
          cVar5 = std::
                  _Rb_tree<QString,_std::pair<const_QString,_int>,_std::_Select1st<std::pair<const_QString,_int>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>
                  ::find(&(pQVar3->m)._M_t,&(abegin.i)->name);
          pp_Var7 = &cVar5._M_node[1]._M_right;
          if ((_Rb_tree_header *)cVar5._M_node ==
              &(((pQVar1->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
            pp_Var7 = (_Base_ptr *)&local_58;
          }
        }
        iVar8 = *(int *)pp_Var7;
        QMap<QString,_int>::remove(pQVar1,(char *)&(abegin.i)->name);
        abegin = QList<QWizardField>::erase(this_00,abegin.i,abegin.i + 1);
      }
      else {
        abegin.i = abegin.i + 1;
      }
      iVar4 = QList<QWizardField>::end(this_00);
    } while (abegin.i != iVar4.i);
  }
  if (iVar8 != -1) {
    pQVar1 = &this->fieldIndexMap;
    QMap<QString,_int>::detach(pQVar1);
    p_Var6 = *(_Base_ptr *)
              ((long)&(((this->fieldIndexMap).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    QMap<QString,_int>::detach(pQVar1);
    if ((_Rb_tree_header *)p_Var6 !=
        &(((this->fieldIndexMap).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      do {
        iVar2 = *(int *)&p_Var6[1]._M_right;
        if (iVar8 < iVar2) {
          local_58.d.d = *(Data **)(p_Var6 + 1);
          local_58.d.ptr = (char16_t *)p_Var6[1]._M_parent;
          local_58.d.size = (qsizetype)p_Var6[1]._M_left;
          if ((_Base_ptr)local_58.d.d != (_Base_ptr)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&((_Base_ptr)local_58.d.d)->_M_color)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&((_Base_ptr)local_58.d.d)->_M_color)->_q_value).
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_5c = iVar2 + -1;
          QMap<QString,_int>::insert(pQVar1,&local_58,&local_5c);
          if ((_Base_ptr)local_58.d.d != (_Base_ptr)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        QMap<QString,_int>::detach(pQVar1);
      } while ((_Rb_tree_header *)p_Var6 !=
               &(((pQVar1->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::_q_handleFieldObjectDestroyed(QObject *object)
{
    int destroyed_index = -1;
    QList<QWizardField>::iterator it = fields.begin();
    while (it != fields.end()) {
        const QWizardField &field = *it;
        if (field.object == object) {
            destroyed_index = fieldIndexMap.value(field.name, -1);
            fieldIndexMap.remove(field.name);
            it = fields.erase(it);
        } else {
            ++it;
        }
    }
    if (destroyed_index != -1) {
        QMap<QString, int>::iterator it2 = fieldIndexMap.begin();
        while (it2 != fieldIndexMap.end()) {
            int index = it2.value();
            if (index > destroyed_index) {
                QString field_name = it2.key();
                fieldIndexMap.insert(field_name, index-1);
            }
            ++it2;
        }
    }
}